

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

void expand_coll(coll_request_t *c)

{
  int iVar1;
  state_t *psVar2;
  coll_request_t **__dest;
  coll_header_t *__dest_00;
  coll_request_t *pcVar3;
  int local_3c;
  coll_header_t *new_headers;
  coll_request_t **new_collcoa_set;
  bsc_size_t new_collcoa_set_reserved;
  state_t *sbsc;
  coll_request_t *item;
  coll_request_t *c_local;
  
  psVar2 = bsc();
  if ((psVar2->collcoa).n_buckets == 0) {
    hash_table_create(&psVar2->collcoa,1000,collcoa_is_equal,collcoa_hash);
  }
  if (psVar2->collcoa_set_size == psVar2->collcoa_set_reserved) {
    if (SBORROW4(1000,psVar2->collcoa_set_reserved * 2) ==
        psVar2->collcoa_set_reserved * -2 + 1000 < 0) {
      local_3c = 1000;
    }
    else {
      local_3c = psVar2->collcoa_set_reserved << 1;
    }
    __dest = (coll_request_t **)calloc((long)local_3c,8);
    __dest_00 = (coll_header_t *)calloc((long)local_3c,0x18);
    if ((__dest == (coll_request_t **)0x0) || (__dest_00 == (coll_header_t *)0x0)) {
      bsp_abort("bsc_sync: insufficient memory\n");
    }
    memcpy(__dest,psVar2->collcoa_set,(long)psVar2->collcoa_set_size << 3);
    memcpy(__dest_00,psVar2->collcoa_headers,(long)psVar2->collcoa_set_size * 0x18);
    free(psVar2->collcoa_set);
    free(psVar2->collcoa_headers);
    psVar2->collcoa_set = __dest;
    psVar2->collcoa_headers = __dest_00;
    psVar2->collcoa_set_reserved = local_3c;
  }
  pcVar3 = (coll_request_t *)hash_table_new_item(&psVar2->collcoa,c);
  if (pcVar3 == c) {
    if (psVar2->collcoa_set_reserved <= psVar2->collcoa_set_size) {
      __assert_fail("sbsc->collcoa_set_size < sbsc->collcoa_set_reserved",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                    ,0x112,"void expand_coll(coll_request_t *)");
    }
    iVar1 = psVar2->collcoa_set_size;
    psVar2->collcoa_set_size = iVar1 + 1;
    psVar2->collcoa_set[iVar1] = pcVar3;
  }
  else {
    c->next = pcVar3->next;
    pcVar3->next = c;
  }
  return;
}

Assistant:

static void expand_coll( coll_request_t * c )
{
    coll_request_t * item; 
    state_t * const sbsc = bsc();
    if ( sbsc->collcoa.n_buckets == 0 ) {
        hash_table_create( & sbsc->collcoa, 1000,
                collcoa_is_equal, collcoa_hash );
    }
    
    if ( sbsc->collcoa_set_size == sbsc->collcoa_set_reserved )
    {
        bsc_size_t new_collcoa_set_reserved =
            MAX(1000, 2*sbsc->collcoa_set_reserved) ;
        coll_request_t ** new_collcoa_set = calloc( 
                new_collcoa_set_reserved, sizeof(coll_request_t*) );
        coll_header_t * new_headers = calloc( 
                new_collcoa_set_reserved, sizeof(coll_header_t) );
        if ( !new_collcoa_set || ! new_headers )
            bsp_abort("bsc_sync: insufficient memory\n");
        memcpy( new_collcoa_set, sbsc->collcoa_set, 
                sizeof(coll_request_t*)*sbsc->collcoa_set_size );
        memcpy( new_headers, sbsc->collcoa_headers,
                sizeof(coll_header_t)*sbsc->collcoa_set_size );
        free(sbsc->collcoa_set);
        free(sbsc->collcoa_headers);
        sbsc->collcoa_set = new_collcoa_set;
        sbsc->collcoa_headers = new_headers;
        sbsc->collcoa_set_reserved = new_collcoa_set_reserved;
    }
               
    item = hash_table_new_item( &sbsc->collcoa, c );
    if (item != c) {
        c->next = item->next;
        item->next = c;
    }
    else {
        assert( sbsc->collcoa_set_size < sbsc->collcoa_set_reserved );
        sbsc->collcoa_set[ sbsc->collcoa_set_size++ ] = item;
    }
}